

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wtmath.c
# Opt level: O1

void dwt_per_stride(double *inp,int N,double *lpd,double *hpd,int lpd_len,double *cA,int len_cA,
                   double *cD,int istride,int ostride)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  double *pdVar11;
  int iVar12;
  long lVar13;
  double *pdVar14;
  long local_80;
  double *local_78;
  long local_70;
  ulong local_60;
  int local_44;
  int local_40;
  
  if (0 < len_cA) {
    uVar9 = lpd_len / 2;
    uVar1 = N - (N >> 0x1f) & 0xfffffffe;
    lVar13 = (long)(int)uVar9;
    lVar5 = (long)N;
    lVar2 = (long)istride;
    local_60 = lVar13 - lVar5;
    local_80 = -lVar13;
    local_44 = (~N + uVar9) * istride;
    local_78 = inp + local_60 * lVar2;
    local_40 = (uVar9 + N + 1) * istride;
    uVar8 = 0;
    local_70 = lVar13;
    do {
      lVar7 = uVar8 * (long)ostride;
      cA[lVar7] = 0.0;
      cD[lVar7] = 0.0;
      if (0 < lpd_len) {
        uVar4 = 0;
        lVar3 = local_70;
        pdVar14 = local_78;
        iVar12 = local_40;
        iVar6 = local_44;
        do {
          lVar10 = (lVar13 + uVar8 * 2) - uVar4;
          if (lVar3 < lVar5 && lVar13 <= lVar3) {
            pdVar11 = inp + lVar10 * lVar2;
LAB_0010f996:
            cA[lVar7] = lpd[uVar4] * *pdVar11 + cA[lVar7];
            cD[lVar7] = hpd[uVar4] * *pdVar11 + cD[lVar7];
          }
          else {
            if ((uint)lVar3 < uVar9) {
              lVar10 = lVar10 * lVar2;
LAB_0010f956:
              pdVar11 = inp + lVar10;
              goto LAB_0010f996;
            }
            if (lVar3 < 0 && N == uVar1) {
              pdVar11 = inp + (lVar10 + lVar5) * lVar2;
              goto LAB_0010f996;
            }
            if (N % 2 == 1 && lVar3 < 0) {
              pdVar11 = inp + (N + -1) * istride;
              if (local_80 + uVar4 != 1) {
                lVar10 = (long)iVar12;
                goto LAB_0010f956;
              }
              goto LAB_0010f996;
            }
            pdVar11 = pdVar14;
            if (N == uVar1 && lVar5 <= lVar3) goto LAB_0010f996;
            if (N % 2 == 1 && lVar5 <= lVar3) {
              pdVar11 = inp + (N + -1) * istride;
              if (local_60 != uVar4) {
                lVar10 = (long)iVar6;
                goto LAB_0010f956;
              }
              goto LAB_0010f996;
            }
          }
          uVar4 = uVar4 + 1;
          lVar3 = lVar3 + -1;
          iVar6 = iVar6 - istride;
          pdVar14 = pdVar14 + -lVar2;
          iVar12 = iVar12 - istride;
        } while ((uint)lpd_len != uVar4);
      }
      uVar8 = uVar8 + 1;
      local_60 = local_60 + 2;
      local_80 = local_80 + -2;
      local_70 = local_70 + 2;
      local_44 = local_44 + istride * 2;
      local_78 = local_78 + lVar2 * 2;
      local_40 = local_40 + istride * 2;
    } while (uVar8 != (uint)len_cA);
  }
  return;
}

Assistant:

void dwt_per_stride(double *inp, int N, double *lpd,double*hpd,int lpd_len,double *cA, int len_cA, double *cD, int istride, int ostride) {
	int l, l2, isodd, i, t, len_avg,is,os;

	len_avg = lpd_len;
	l2 = len_avg / 2;
	isodd = N % 2;

	for (i = 0; i < len_cA; ++i) {
		t = 2 * i + l2;
		os = i *ostride;
		cA[os] = 0.0;
		cD[os] = 0.0;
		for (l = 0; l < len_avg; ++l) {
			if ((t - l) >= l2 && (t - l) < N) {
				is = (t - l) * istride;
				cA[os] += lpd[l] * inp[is];
				cD[os] += hpd[l] * inp[is];
			}
			else if ((t - l) < l2 && (t - l) >= 0) {
				is = (t - l) * istride;
				cA[os] += lpd[l] * inp[is];
				cD[os] += hpd[l] * inp[is];
			}
			else if ((t - l) < 0 && isodd == 0) {
				is = (t - l + N) * istride;
				cA[os] += lpd[l] * inp[is];
				cD[os] += hpd[l] * inp[is];
			}
			else if ((t - l) < 0 && isodd == 1) {
				if ((t - l) != -1) {
					is = (t - l + N + 1) * istride;
					cA[os] += lpd[l] * inp[is];
					cD[os] += hpd[l] * inp[is];
				}
				else {
					is = (N - 1) * istride;
					cA[os] += lpd[l] * inp[is];
					cD[os] += hpd[l] * inp[is];
				}
			}
			else if ((t - l) >= N && isodd == 0) {
				is = (t - l - N) * istride;
				cA[os] += lpd[l] * inp[is];
				cD[os] += hpd[l] * inp[is];
			}
			else if ((t - l) >= N && isodd == 1) {
				is = (t - l - (N + 1)) * istride;
				if (t - l != N) {
					cA[os] += lpd[l] * inp[is];
					cD[os] += hpd[l] * inp[is];
				}
				else {
					is = (N - 1) * istride;
					cA[os] += lpd[l] * inp[is];
					cD[os] += hpd[l] * inp[is];
				}
			}

		}
		
	}

}